

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::getDualViolation
          (SoPlexBase<double> *this,double *maxviol,double *sumviol)

{
  bool bVar1;
  int row;
  VarStatus VVar2;
  int iVar3;
  double *pdVar4;
  double *in_RDX;
  double *in_RSI;
  SoPlexBase<double> *in_RDI;
  VarStatus rowStatus;
  int r;
  VectorBase<double> *dual;
  int n;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SoPlexBase<double> *this_00;
  bool local_1;
  
  bVar1 = hasBasis(in_RDI);
  if (bVar1) {
    _syncRealSolution((SoPlexBase<double> *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    this_00 = (SoPlexBase<double> *)&(in_RDI->_solReal)._dual;
    *in_RSI = 0.0;
    *in_RDX = 0.0;
    row = numRows((SoPlexBase<double> *)0x45ebbb);
    while (row = row + -1, -1 < row) {
      VVar2 = basisRowStatus(this_00,row);
      iVar3 = intParam(in_RDI,OBJSENSE);
      n = (int)((ulong)in_RDI >> 0x20);
      if (iVar3 == -1) {
        if (((VVar2 != ON_UPPER) && (VVar2 != FIXED)) &&
           (pdVar4 = VectorBase<double>::operator[]((VectorBase<double> *)CONCAT44(row,VVar2),n),
           *pdVar4 <= 0.0 && *pdVar4 != 0.0)) {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)CONCAT44(row,VVar2),(int)((ulong)in_RDI >> 0x20)
                             );
          *in_RDX = -*pdVar4 + *in_RDX;
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)CONCAT44(row,VVar2),(int)((ulong)in_RDI >> 0x20)
                             );
          if (*pdVar4 < -*in_RSI) {
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)CONCAT44(row,VVar2),
                                (int)((ulong)in_RDI >> 0x20));
            *in_RSI = -*pdVar4;
          }
        }
        if (((VVar2 != ON_LOWER) && (VVar2 != FIXED)) &&
           (pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)CONCAT44(row,VVar2),
                                (int)((ulong)in_RDI >> 0x20)), 0.0 < *pdVar4)) {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)CONCAT44(row,VVar2),(int)((ulong)in_RDI >> 0x20)
                             );
          *in_RDX = *pdVar4 + *in_RDX;
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)CONCAT44(row,VVar2),(int)((ulong)in_RDI >> 0x20)
                             );
          if (*in_RSI <= *pdVar4 && *pdVar4 != *in_RSI) {
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)CONCAT44(row,VVar2),
                                (int)((ulong)in_RDI >> 0x20));
            *in_RSI = *pdVar4;
          }
        }
      }
      else {
        if (((VVar2 != ON_UPPER) && (VVar2 != FIXED)) &&
           (pdVar4 = VectorBase<double>::operator[]((VectorBase<double> *)CONCAT44(row,VVar2),n),
           0.0 < *pdVar4)) {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)CONCAT44(row,VVar2),(int)((ulong)in_RDI >> 0x20)
                             );
          *in_RDX = *pdVar4 + *in_RDX;
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)CONCAT44(row,VVar2),(int)((ulong)in_RDI >> 0x20)
                             );
          if (*in_RSI <= *pdVar4 && *pdVar4 != *in_RSI) {
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)CONCAT44(row,VVar2),
                                (int)((ulong)in_RDI >> 0x20));
            *in_RSI = *pdVar4;
          }
        }
        if (((VVar2 != ON_LOWER) && (VVar2 != FIXED)) &&
           (pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)CONCAT44(row,VVar2),
                                (int)((ulong)in_RDI >> 0x20)), *pdVar4 <= 0.0 && *pdVar4 != 0.0)) {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)CONCAT44(row,VVar2),(int)((ulong)in_RDI >> 0x20)
                             );
          *in_RDX = -*pdVar4 + *in_RDX;
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)CONCAT44(row,VVar2),(int)((ulong)in_RDI >> 0x20)
                             );
          if (*pdVar4 < -*in_RSI) {
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)CONCAT44(row,VVar2),
                                (int)((ulong)in_RDI >> 0x20));
            *in_RSI = -*pdVar4;
          }
        }
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SoPlexBase<R>::getDualViolation(R& maxviol, R& sumviol)
{
   if(!hasBasis())
      return false;

   _syncRealSolution();
   VectorBase<R>& dual = _solReal._dual;
   assert(dual.dim() == numRows());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int r = numRows() - 1; r >= 0; r--)
   {
      typename SPxSolverBase<R>::VarStatus rowStatus = basisRowStatus(r);

      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MINIMIZE)
      {
         if(rowStatus != SPxSolverBase<R>::ON_UPPER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] < 0.0)
         {
            sumviol += -dual[r];

            if(dual[r] < -maxviol)
               maxviol = -dual[r];
         }

         if(rowStatus != SPxSolverBase<R>::ON_LOWER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] > 0.0)
         {
            sumviol += dual[r];

            if(dual[r] > maxviol)
               maxviol = dual[r];
         }
      }
      else
      {
         if(rowStatus != SPxSolverBase<R>::ON_UPPER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] > 0.0)
         {
            sumviol += dual[r];

            if(dual[r] > maxviol)
               maxviol = dual[r];
         }

         if(rowStatus != SPxSolverBase<R>::ON_LOWER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] < 0.0)
         {
            sumviol += -dual[r];

            if(dual[r] < -maxviol)
               maxviol = -dual[r];
         }
      }
   }

   return true;
}